

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_iov.c
# Opt level: O0

void mk_iov_print(mk_iov *mk_io)

{
  char *c;
  uint j;
  int i;
  mk_iov *mk_io_local;
  
  for (c._4_4_ = 0; (int)c._4_4_ < mk_io->iov_idx; c._4_4_ = c._4_4_ + 1) {
    printf("\n[index=%i len=%i]\n\'",(ulong)c._4_4_,mk_io->io[(int)c._4_4_].iov_len & 0xffffffff);
    fflush(_stdout);
    c._0_4_ = 0;
    while( true ) {
      if (mk_io->io[(int)c._4_4_].iov_len <= (ulong)(uint)c) break;
      printf("%c",(ulong)(uint)(int)*(char *)((long)mk_io->io[(int)c._4_4_].iov_base +
                                             (ulong)(uint)c));
      fflush(_stdout);
      c._0_4_ = (uint)c + 1;
    }
    printf("\'[end=%i]\n",(ulong)(uint)c);
    fflush(_stdout);
  }
  return;
}

Assistant:

void mk_iov_print(struct mk_iov *mk_io)
{
    int i;
    unsigned j;
    char *c;

    for (i = 0; i < mk_io->iov_idx; i++) {
        printf("\n[index=%i len=%i]\n'", i, (int) mk_io->io[i].iov_len);
        fflush(stdout);

        for (j=0; j < mk_io->io[i].iov_len; j++) {
            c = mk_io->io[i].iov_base;
            printf("%c", c[j]);
            fflush(stdout);
        }
        printf("'[end=%i]\n", j);
        fflush(stdout);
    }
}